

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_attachments2
          (Impl *this,Value *attachments,VkAttachmentDescription2 **out_attachments)

{
  bool bVar1;
  SizeType SVar2;
  VkAttachmentDescription2 *pVVar3;
  ConstValueIterator pGVar4;
  Type pnext;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  ConstValueIterator itr;
  VkAttachmentDescription2 *ret;
  VkAttachmentDescription2 *infos;
  VkAttachmentDescription2 **out_attachments_local;
  Value *attachments_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar3 = ScratchAllocator::allocate_n_cleared<VkAttachmentDescription2>
                     (&this->allocator,(ulong)SVar2);
  obj = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::Begin(attachments);
  ret = pVVar3;
  do {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(attachments);
    if (obj == pGVar4) {
      *out_attachments = pVVar3;
      return true;
    }
    ret->sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
    parse_render_pass_attachments_base<VkAttachmentDescription2>(ret,obj);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(obj,"pNext");
    if (bVar1) {
      pnext = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)obj,"pNext");
      bVar1 = parse_pnext_chain(this,pnext,&ret->pNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) {
        return false;
      }
    }
    obj = obj + 1;
    ret = ret + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_attachments2(const Value &attachments, const VkAttachmentDescription2 **out_attachments)
{
	auto *infos = allocator.allocate_n_cleared<VkAttachmentDescription2>(attachments.Size());
	auto *ret = infos;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, infos++)
	{
		auto &obj = *itr;
		infos->sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
		parse_render_pass_attachments_base(*infos, *itr);
		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &infos->pNext))
				return false;
	}

	*out_attachments = ret;
	return true;
}